

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

bool __thiscall chrono::ChOptimizerGradient::DoOptimize(ChOptimizerGradient *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  Index IVar8;
  double *pdVar9;
  Index IVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  Index index;
  int iVar14;
  Index index_8;
  int iVar15;
  ActualDstType actualDst;
  ulong size_00;
  ulong uVar16;
  char *pcVar17;
  Index size;
  Index index_1;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM3 [16];
  ChVectorDynamic<> mX;
  ChVectorDynamic<> mXmid;
  ChVectorDynamic<> mG;
  ChVectorDynamic<> mXguess;
  ChVectorDynamic<> mX2;
  ChVectorDynamic<> mX1;
  ChVectorDynamic<> mGcn;
  ChVectorDynamic<> mGcnold;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_168;
  double local_158;
  undefined8 uStack_150;
  double local_140;
  double local_138;
  double local_130;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  double local_108;
  undefined8 uStack_100;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  scalar_sum_op<double,_double> local_d9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c8;
  int local_ac;
  double local_a8;
  undefined8 uStack_a0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  double local_78;
  int local_6c;
  double local_68;
  undefined8 uStack_60;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_50;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_40;
  
  local_ac = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  local_a8 = this->initial_step;
  size_00 = (ulong)local_ac;
  uStack_a0 = 0;
  local_168.m_storage.m_data = (double *)0x0;
  local_168.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_168,size_00);
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,size_00);
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,size_00);
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,size_00);
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,size_00);
  local_128.m_storage.m_data = (double *)0x0;
  local_128.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,size_00);
  local_c8.m_storage.m_data = (double *)0x0;
  local_c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,size_00);
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,size_00);
  if (0 < local_ac) {
    pdVar5 = (this->super_ChOptimizer).xv;
    uVar16 = 0;
    do {
      if ((~(local_168.m_storage.m_rows >> 0x3f) & local_168.m_storage.m_rows) == uVar16)
      goto LAB_007d0172;
      local_168.m_storage.m_data[uVar16] = pdVar5[uVar16];
      uVar16 = uVar16 + 1;
    } while (size_00 != uVar16);
  }
  local_130 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_168);
  local_138 = 0.0;
  local_140 = 0.0;
  local_108 = 0.0;
  local_78 = 0.0;
  do {
    ChOptimizer::Eval_grad
              (&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_168,
               (ChVectorDynamic<> *)&local_118);
    if (this->do_conjugate == true) {
      local_50.m_xpr = (XprTypeNested)&local_118;
      if (local_118.m_storage.m_rows == 0) {
        uVar16 = 0;
        local_158 = 0.0;
      }
      else {
        if (local_118.m_storage.m_rows < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        local_40.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
        .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_118.m_storage.m_data;
        local_158 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                    ::
                    run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              (&local_40,&local_d9,&local_50);
        uVar16 = local_118.m_storage.m_rows;
      }
      pdVar5 = local_118.m_storage.m_data;
      if ((local_98.m_storage.m_rows == uVar16) ||
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_98,uVar16,1), local_98.m_storage.m_rows == uVar16)) {
        pdVar9 = local_98.m_storage.m_data;
        uVar18 = uVar16 + 7;
        if (-1 < (long)uVar16) {
          uVar18 = uVar16;
        }
        uVar18 = uVar18 & 0xfffffffffffffff8;
        if (7 < (long)uVar16) {
          lVar12 = 0;
          do {
            *(undefined1 (*) [64])(local_98.m_storage.m_data + lVar12) =
                 *(undefined1 (*) [64])(pdVar5 + lVar12);
            lVar12 = lVar12 + 8;
          } while (lVar12 < (long)uVar18);
        }
        uVar13 = uVar18;
        if ((long)uVar18 < (long)uVar16) {
          do {
            local_98.m_storage.m_data[uVar13] = pdVar5[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar16 != uVar13);
        }
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_158;
        auVar19 = vsqrtsd_avx(in_XMM3,auVar19);
        local_158 = auVar19._0_8_;
        if ((this->super_ChOptimizer).grad_evaluations < 2) {
          if ((local_88.m_storage.m_rows != uVar16) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_88,uVar16,1), local_88.m_storage.m_rows != uVar16))
          goto LAB_007d0194;
        }
        else {
          if (local_88.m_storage.m_rows < 0) goto LAB_007d0117;
          if (uVar16 != local_88.m_storage.m_rows) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                         );
          }
          uVar13 = uVar16 & 0xfffffffffffffff8;
          auVar23._0_8_ = local_158 / local_78;
          auVar23._8_8_ = 0;
          if (7 < uVar16) {
            auVar20 = vbroadcastsd_avx512f(auVar23);
            lVar12 = 0;
            do {
              auVar21 = vmulpd_avx512f(auVar20,*(undefined1 (*) [64])
                                                (local_88.m_storage.m_data + lVar12));
              auVar21 = vaddpd_avx512f(auVar21,*(undefined1 (*) [64])
                                                (local_98.m_storage.m_data + lVar12));
              *(undefined1 (*) [64])(local_98.m_storage.m_data + lVar12) = auVar21;
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar13);
          }
          for (; uVar13 != uVar16; uVar13 = uVar13 + 1) {
            local_98.m_storage.m_data[uVar13] =
                 auVar23._0_8_ * local_88.m_storage.m_data[uVar13] +
                 local_98.m_storage.m_data[uVar13];
          }
        }
        IVar8 = local_98.m_storage.m_rows;
        pdVar5 = local_98.m_storage.m_data;
        if (7 < (long)uVar16) {
          lVar12 = 0;
          do {
            *(undefined1 (*) [64])(local_88.m_storage.m_data + lVar12) =
                 *(undefined1 (*) [64])(pdVar9 + lVar12);
            lVar12 = lVar12 + 8;
          } while (lVar12 < (long)uVar18);
        }
        if ((long)uVar18 < (long)uVar16) {
          do {
            local_88.m_storage.m_data[uVar18] = pdVar9[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        if ((local_118.m_storage.m_rows == local_98.m_storage.m_rows) ||
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_118,local_98.m_storage.m_rows,1), local_118.m_storage.m_rows == IVar8)
           ) {
          uVar16 = IVar8 + 7;
          if (-1 < IVar8) {
            uVar16 = IVar8;
          }
          uVar16 = uVar16 & 0xfffffffffffffff8;
          if (7 < IVar8) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_118.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar16);
          }
          if ((long)uVar16 < IVar8) {
            do {
              local_118.m_storage.m_data[uVar16] = pdVar5[uVar16];
              uVar16 = uVar16 + 1;
            } while (IVar8 != uVar16);
          }
          local_78 = local_158;
          goto LAB_007cf3e3;
        }
      }
LAB_007d0194:
      pcVar17 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007d01a9:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar17);
    }
LAB_007cf3e3:
    dVar22 = local_138;
    if (-1 < this->maxdilationsteps) {
      local_158 = local_130;
      iVar15 = 0;
      do {
        IVar8 = local_118.m_storage.m_rows;
        pdVar9 = local_118.m_storage.m_data;
        pdVar5 = local_168.m_storage.m_data;
        if (local_118.m_storage.m_rows < 0) goto LAB_007d0117;
        if (local_168.m_storage.m_rows != local_118.m_storage.m_rows) goto LAB_007d0139;
        if ((local_f8.m_storage.m_rows != local_118.m_storage.m_rows) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_f8,local_118.m_storage.m_rows,1), local_f8.m_storage.m_rows != IVar8))
        goto LAB_007d015b;
        uVar16 = IVar8 & 0x7ffffffffffffff8;
        if (7 < (ulong)IVar8) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_a8;
          auVar20 = vbroadcastsd_avx512f(auVar1);
          uVar18 = 0;
          do {
            auVar21 = vmulpd_avx512f(auVar20,*(undefined1 (*) [64])(pdVar9 + uVar18));
            auVar21 = vaddpd_avx512f(auVar21,*(undefined1 (*) [64])(pdVar5 + uVar18));
            *(undefined1 (*) [64])(local_f8.m_storage.m_data + uVar18) = auVar21;
            uVar18 = uVar18 + 8;
          } while (uVar18 < uVar16);
        }
        if ((long)uVar16 < IVar8) {
          do {
            local_f8.m_storage.m_data[uVar16] = local_a8 * pdVar9[uVar16] + pdVar5[uVar16];
            uVar16 = uVar16 + 1;
          } while (IVar8 != uVar16);
        }
        dVar22 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_f8);
        if (dVar22 <= local_158) break;
        local_a8 = local_a8 * this->dilation;
        uStack_a0 = 0;
        bVar6 = iVar15 < this->maxdilationsteps;
        iVar15 = iVar15 + 1;
        local_158 = dVar22;
      } while (bVar6);
    }
    IVar8 = local_118.m_storage.m_rows;
    pdVar9 = local_118.m_storage.m_data;
    pdVar5 = local_168.m_storage.m_data;
    local_158 = local_a8 * 0.5;
    uStack_150 = 0;
    local_138 = dVar22;
    if (local_118.m_storage.m_rows < 0) {
LAB_007d0117:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (local_168.m_storage.m_rows != local_118.m_storage.m_rows) {
LAB_007d0139:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    if ((local_128.m_storage.m_rows != local_118.m_storage.m_rows) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_128,local_118.m_storage.m_rows,1), local_128.m_storage.m_rows != IVar8)) {
LAB_007d015b:
      pcVar17 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
      ;
      goto LAB_007d01a9;
    }
    uVar16 = IVar8 & 0x7ffffffffffffff8;
    if (7 < (ulong)IVar8) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_158;
      auVar20 = vbroadcastsd_avx512f(auVar2);
      uVar18 = 0;
      do {
        auVar21 = vmulpd_avx512f(auVar20,*(undefined1 (*) [64])(pdVar9 + uVar18));
        auVar21 = vaddpd_avx512f(auVar21,*(undefined1 (*) [64])(pdVar5 + uVar18));
        *(undefined1 (*) [64])(local_128.m_storage.m_data + uVar18) = auVar21;
        uVar18 = uVar18 + 8;
      } while (uVar18 < uVar16);
    }
    if ((long)uVar16 < IVar8) {
      do {
        local_128.m_storage.m_data[uVar16] = local_158 * pdVar9[uVar16] + pdVar5[uVar16];
        uVar16 = uVar16 + 1;
      } while (IVar8 != uVar16);
    }
    local_158 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_128);
    if ((-1 < this->maxbisections) &&
       ((this->super_ChOptimizer).fx_evaluations <= (long)this->maxevaluations)) {
      iVar15 = 1;
      iVar14 = 0;
      do {
        iVar11 = iVar15;
        IVar8 = local_118.m_storage.m_rows;
        pdVar9 = local_118.m_storage.m_data;
        pdVar5 = local_168.m_storage.m_data;
        local_68 = local_a8 * 0.25;
        uStack_60 = 0;
        if (local_118.m_storage.m_rows < 0) goto LAB_007d0117;
        local_6c = iVar14;
        if (local_168.m_storage.m_rows != local_118.m_storage.m_rows) goto LAB_007d0139;
        if ((local_c8.m_storage.m_rows != local_118.m_storage.m_rows) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_c8,local_118.m_storage.m_rows,1), local_c8.m_storage.m_rows != IVar8))
        goto LAB_007d015b;
        uVar16 = IVar8 & 0x7ffffffffffffff8;
        if (7 < (ulong)IVar8) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_68;
          auVar20 = vbroadcastsd_avx512f(auVar3);
          uVar18 = 0;
          do {
            auVar21 = vmulpd_avx512f(auVar20,*(undefined1 (*) [64])(pdVar9 + uVar18));
            auVar21 = vaddpd_avx512f(auVar21,*(undefined1 (*) [64])(pdVar5 + uVar18));
            *(undefined1 (*) [64])(local_c8.m_storage.m_data + uVar18) = auVar21;
            uVar18 = uVar18 + 8;
          } while (uVar18 < uVar16);
        }
        if ((long)uVar16 < IVar8) {
          do {
            local_c8.m_storage.m_data[uVar16] = local_68 * pdVar9[uVar16] + pdVar5[uVar16];
            uVar16 = uVar16 + 1;
          } while (IVar8 != uVar16);
        }
        local_140 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_c8);
        IVar8 = local_118.m_storage.m_rows;
        pdVar9 = local_118.m_storage.m_data;
        pdVar5 = local_168.m_storage.m_data;
        local_108 = local_a8 * 0.75;
        uStack_100 = 0;
        if (local_118.m_storage.m_rows < 0) goto LAB_007d0117;
        if (local_168.m_storage.m_rows != local_118.m_storage.m_rows) goto LAB_007d0139;
        if ((local_d8.m_storage.m_rows != local_118.m_storage.m_rows) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_d8,local_118.m_storage.m_rows,1), local_d8.m_storage.m_rows != IVar8))
        goto LAB_007d015b;
        uVar16 = IVar8 & 0x7ffffffffffffff8;
        if (7 < (ulong)IVar8) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_108;
          auVar20 = vbroadcastsd_avx512f(auVar4);
          uVar18 = 0;
          do {
            auVar21 = vmulpd_avx512f(auVar20,*(undefined1 (*) [64])(pdVar9 + uVar18));
            auVar21 = vaddpd_avx512f(auVar21,*(undefined1 (*) [64])(pdVar5 + uVar18));
            *(undefined1 (*) [64])(local_d8.m_storage.m_data + uVar18) = auVar21;
            uVar18 = uVar18 + 8;
          } while (uVar18 < uVar16);
        }
        if ((long)uVar16 < IVar8) {
          do {
            local_d8.m_storage.m_data[uVar16] = local_108 * pdVar9[uVar16] + pdVar5[uVar16];
            uVar16 = uVar16 + 1;
          } while (IVar8 != uVar16);
        }
        local_108 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_d8);
        IVar8 = local_128.m_storage.m_rows;
        pdVar5 = local_128.m_storage.m_data;
        bVar6 = false;
        if ((local_140 <= local_158) && (bVar6 = false, local_158 <= local_108)) {
          if ((local_168.m_storage.m_rows != local_128.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_168,local_128.m_storage.m_rows,1),
             local_168.m_storage.m_rows != IVar8)) goto LAB_007d0194;
          IVar10 = local_d8.m_storage.m_rows;
          pdVar9 = local_d8.m_storage.m_data;
          uVar16 = IVar8 + 7;
          if (-1 < IVar8) {
            uVar16 = IVar8;
          }
          uVar16 = uVar16 & 0xfffffffffffffff8;
          if (7 < IVar8) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_168.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar16);
          }
          if ((long)uVar16 < IVar8) {
            do {
              local_168.m_storage.m_data[uVar16] = pdVar5[uVar16];
              uVar16 = uVar16 + 1;
            } while (IVar8 != uVar16);
          }
          if ((local_128.m_storage.m_rows != local_d8.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_128,local_d8.m_storage.m_rows,1),
             local_128.m_storage.m_rows != IVar10)) goto LAB_007d0194;
          uVar16 = IVar10 + 7;
          if (-1 < IVar10) {
            uVar16 = IVar10;
          }
          uVar16 = uVar16 & 0xfffffffffffffff8;
          if (7 < IVar10) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_128.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar9 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar16);
          }
          if ((long)uVar16 < IVar10) {
            do {
              local_128.m_storage.m_data[uVar16] = pdVar9[uVar16];
              uVar16 = uVar16 + 1;
            } while (IVar10 != uVar16);
          }
          local_130 = local_158;
          local_158 = local_108;
          bVar6 = true;
        }
        IVar8 = local_128.m_storage.m_rows;
        pdVar5 = local_128.m_storage.m_data;
        if (((local_158 <= local_140) && (local_108 <= local_158)) && (!bVar6)) {
          if ((local_f8.m_storage.m_rows != local_128.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_f8,local_128.m_storage.m_rows,1), local_f8.m_storage.m_rows != IVar8
             )) goto LAB_007d0194;
          IVar10 = local_c8.m_storage.m_rows;
          pdVar9 = local_c8.m_storage.m_data;
          uVar16 = IVar8 + 7;
          if (-1 < IVar8) {
            uVar16 = IVar8;
          }
          uVar16 = uVar16 & 0xfffffffffffffff8;
          if (7 < IVar8) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_f8.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar16);
          }
          if ((long)uVar16 < IVar8) {
            do {
              local_f8.m_storage.m_data[uVar16] = pdVar5[uVar16];
              uVar16 = uVar16 + 1;
            } while (IVar8 != uVar16);
          }
          if ((local_128.m_storage.m_rows != local_c8.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_128,local_c8.m_storage.m_rows,1),
             local_128.m_storage.m_rows != IVar10)) goto LAB_007d0194;
          uVar16 = IVar10 + 7;
          if (-1 < IVar10) {
            uVar16 = IVar10;
          }
          uVar16 = uVar16 & 0xfffffffffffffff8;
          if (7 < IVar10) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_128.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar9 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar16);
          }
          bVar6 = true;
          if ((long)uVar16 < IVar10) {
            do {
              local_128.m_storage.m_data[uVar16] = pdVar9[uVar16];
              uVar16 = uVar16 + 1;
            } while (IVar10 != uVar16);
          }
          local_138 = local_158;
          local_158 = local_140;
        }
        IVar8 = local_c8.m_storage.m_rows;
        pdVar5 = local_c8.m_storage.m_data;
        if ((local_158 < local_140) || (local_158 < local_108)) {
          if (!bVar6) {
            local_a8 = local_68;
            uStack_a0 = uStack_60;
            break;
          }
        }
        else if (!bVar6) {
          if ((local_168.m_storage.m_rows != local_c8.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_168,local_c8.m_storage.m_rows,1),
             local_168.m_storage.m_rows != IVar8)) goto LAB_007d0194;
          IVar10 = local_d8.m_storage.m_rows;
          pdVar9 = local_d8.m_storage.m_data;
          uVar16 = IVar8 + 7;
          if (-1 < IVar8) {
            uVar16 = IVar8;
          }
          uVar16 = uVar16 & 0xfffffffffffffff8;
          if (7 < IVar8) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_168.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar16);
          }
          if ((long)uVar16 < IVar8) {
            do {
              local_168.m_storage.m_data[uVar16] = pdVar5[uVar16];
              uVar16 = uVar16 + 1;
            } while (IVar8 != uVar16);
          }
          if ((local_f8.m_storage.m_rows != local_d8.m_storage.m_rows) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_f8,local_d8.m_storage.m_rows,1), local_f8.m_storage.m_rows != IVar10
             )) goto LAB_007d0194;
          uVar16 = IVar10 + 7;
          if (-1 < IVar10) {
            uVar16 = IVar10;
          }
          uVar16 = uVar16 & 0xfffffffffffffff8;
          if (7 < IVar10) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_f8.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar9 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar16);
          }
          local_138 = local_108;
          local_130 = local_140;
          if ((long)uVar16 < IVar10) {
            do {
              local_f8.m_storage.m_data[uVar16] = pdVar9[uVar16];
              uVar16 = uVar16 + 1;
            } while (IVar10 != uVar16);
          }
        }
        auVar7._8_8_ = 0x7fffffffffffffff;
        auVar7._0_8_ = 0x7fffffffffffffff;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_158 - local_130;
        auVar19 = vandpd_avx512vl(auVar24,auVar7);
        if (auVar19._0_8_ <= this->fun_tol) {
          builtin_strncpy((this->super_ChOptimizer).err_message,"OK,function tolerance reached.",
                          0x1f);
          goto LAB_007cfff2;
        }
        local_a8 = local_a8 * 0.5;
        uStack_a0 = 0;
        if ((this->maxbisections <= local_6c) ||
           (iVar15 = iVar11 + 1, iVar14 = iVar11,
           (long)this->maxevaluations < (this->super_ChOptimizer).fx_evaluations)) break;
      } while( true );
    }
    IVar8 = local_c8.m_storage.m_rows;
    pdVar5 = local_c8.m_storage.m_data;
    if ((local_130 <= local_140) &&
       (((local_158 <= local_140 && (local_108 <= local_140)) && (local_138 <= local_140)))) {
      if ((local_168.m_storage.m_rows != local_c8.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_168,local_c8.m_storage.m_rows,1), local_168.m_storage.m_rows != IVar8))
      goto LAB_007d0194;
      uVar16 = IVar8 + 7;
      if (-1 < IVar8) {
        uVar16 = IVar8;
      }
      uVar16 = uVar16 & 0xfffffffffffffff8;
      if (7 < IVar8) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_168.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar16);
      }
      if ((long)uVar16 < IVar8) {
        do {
          local_168.m_storage.m_data[uVar16] = pdVar5[uVar16];
          uVar16 = uVar16 + 1;
        } while (IVar8 != uVar16);
      }
    }
    IVar8 = local_d8.m_storage.m_rows;
    pdVar5 = local_d8.m_storage.m_data;
    if (((local_140 <= local_108) && (local_130 <= local_108)) &&
       ((local_158 <= local_108 && (local_138 <= local_108)))) {
      if ((local_168.m_storage.m_rows != local_d8.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_168,local_d8.m_storage.m_rows,1), local_168.m_storage.m_rows != IVar8))
      goto LAB_007d0194;
      uVar16 = IVar8 + 7;
      if (-1 < IVar8) {
        uVar16 = IVar8;
      }
      uVar16 = uVar16 & 0xfffffffffffffff8;
      if (7 < IVar8) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_168.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar16);
      }
      if ((long)uVar16 < IVar8) {
        do {
          local_168.m_storage.m_data[uVar16] = pdVar5[uVar16];
          uVar16 = uVar16 + 1;
        } while (IVar8 != uVar16);
      }
    }
    IVar8 = local_128.m_storage.m_rows;
    pdVar5 = local_128.m_storage.m_data;
    if ((((local_130 <= local_158) && (local_140 <= local_158)) && (local_108 <= local_158)) &&
       (local_138 <= local_158)) {
      if ((local_168.m_storage.m_rows != local_128.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_168,local_128.m_storage.m_rows,1), local_168.m_storage.m_rows != IVar8))
      goto LAB_007d0194;
      uVar16 = IVar8 + 7;
      if (-1 < IVar8) {
        uVar16 = IVar8;
      }
      uVar16 = uVar16 & 0xfffffffffffffff8;
      if (7 < IVar8) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_168.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar16);
      }
      if ((long)uVar16 < IVar8) {
        do {
          local_168.m_storage.m_data[uVar16] = pdVar5[uVar16];
          uVar16 = uVar16 + 1;
        } while (IVar8 != uVar16);
      }
    }
    IVar8 = local_f8.m_storage.m_rows;
    pdVar5 = local_f8.m_storage.m_data;
    if (((local_130 <= local_138) && (local_140 <= local_138)) &&
       ((local_158 <= local_138 && (local_108 <= local_138)))) {
      if ((local_168.m_storage.m_rows != local_f8.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_168,local_f8.m_storage.m_rows,1), local_168.m_storage.m_rows != IVar8))
      goto LAB_007d0194;
      uVar16 = IVar8 + 7;
      if (-1 < IVar8) {
        uVar16 = IVar8;
      }
      uVar16 = uVar16 & 0xfffffffffffffff8;
      if (7 < IVar8) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_168.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar16);
      }
      if ((long)uVar16 < IVar8) {
        do {
          local_168.m_storage.m_data[uVar16] = pdVar5[uVar16];
          uVar16 = uVar16 + 1;
        } while (IVar8 != uVar16);
      }
    }
    local_130 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_168);
    if ((long)this->maxevaluations < (this->super_ChOptimizer).fx_evaluations) {
      lVar12 = (this->super_ChOptimizer).grad_evaluations;
      pcVar17 = "OK, limit on max number of fx evaluations reached in %ld steps";
      goto LAB_007cffeb;
    }
    lVar12 = (this->super_ChOptimizer).grad_evaluations;
    if (this->maxgradients < lVar12) {
      pcVar17 = "OK, limit on max number of %ld gradient evaluations reached.";
LAB_007cffeb:
      sprintf((this->super_ChOptimizer).err_message,pcVar17,lVar12);
LAB_007cfff2:
      (this->super_ChOptimizer).opt_fx = local_130;
      if (((this->super_ChOptimizer).C_vars != 0) && (0 < local_ac)) {
        pdVar5 = (this->super_ChOptimizer).xv;
        uVar16 = 0;
        do {
          if ((~(local_168.m_storage.m_rows >> 0x3f) & local_168.m_storage.m_rows) == uVar16) {
LAB_007d0172:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar5[uVar16] = local_168.m_storage.m_data[uVar16];
          uVar16 = uVar16 + 1;
        } while (size_00 != uVar16);
      }
      if (local_d8.m_storage.m_data != (double *)0x0) {
        free((void *)local_d8.m_storage.m_data[-1]);
      }
      if (local_c8.m_storage.m_data != (double *)0x0) {
        free((void *)local_c8.m_storage.m_data[-1]);
      }
      if (local_128.m_storage.m_data != (double *)0x0) {
        free((void *)local_128.m_storage.m_data[-1]);
      }
      if (local_88.m_storage.m_data != (double *)0x0) {
        free((void *)local_88.m_storage.m_data[-1]);
      }
      if (local_98.m_storage.m_data != (double *)0x0) {
        free((void *)local_98.m_storage.m_data[-1]);
      }
      if (local_118.m_storage.m_data != (double *)0x0) {
        free((void *)local_118.m_storage.m_data[-1]);
      }
      if (local_f8.m_storage.m_data != (double *)0x0) {
        free((void *)local_f8.m_storage.m_data[-1]);
      }
      if (local_168.m_storage.m_data != (double *)0x0) {
        free((void *)local_168.m_storage.m_data[-1]);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool ChOptimizerGradient::DoOptimize() {
    double nstep = initial_step;
    int dilationstep;
    int bisections;
    double fx, fxguess = 0, fxmid, fx1 = 0, fx2 = 0, lastgood, normGold = 0, normGnew;

    // count vars
    int nv = GetNumOfVars();

    nstep = initial_step;

    // allocate variables vector
    ChVectorDynamic<> mX(nv);       // the variables
    ChVectorDynamic<> mXguess(nv);  // the guessed variables
    ChVectorDynamic<> mG(nv);       // the gradient
    ChVectorDynamic<> mGcn(nv);     // the conjugate gradient
    ChVectorDynamic<> mGcnold(nv);  // the old conjugate gradient
    ChVectorDynamic<> mXmid(nv);    // the bisection center
    ChVectorDynamic<> mX1(nv);      // the bisection left
    ChVectorDynamic<> mX2(nv);      // the bisection right

    // populate vector with starting approximation
    // system->vector

    for (int i = 0; i < nv; i++) {
        mX(i) = xv[i];
    };
    // System_to_Vars(&mX);

    fx = Eval_fx(mX);

    // perform iterative optimization..

    while (true) {
        // compute gradient here;
        Eval_grad(mX, mG);

        // correction for conjugate gradient method?
        if (do_conjugate) {
            normGnew = mG.norm();
            mGcn = mG;
            if (grad_evaluations > 1) {
                mGcn += (normGnew / normGold) * mGcnold;  // update conj.gradient direction
            }
            mGcnold = mGcn;
            normGold = normGnew;
            mG = mGcn;  // use the conjugate gradient!
        }

        // Forward dilation search;
        dilationstep = 0;
        lastgood = fx;
        while (true) {
            if (dilationstep > maxdilationsteps)
                break;
            dilationstep++;

            // compute new fx position;
            mXguess = mX + nstep * mG;

            fxguess = Eval_fx(mXguess);

            if (fxguess <= lastgood) {
                break;
            }

            nstep *= dilation;
            lastgood = fxguess;
        }

        // Backward bisection search;
        bisections = 0;
        bool gone;

        mXmid = mX + (nstep * 0.5) * mG; // initialize mid

        fxmid = Eval_fx(mXmid);

        while (true) {
            if (bisections > maxbisections)
                break;
            bisections++;
            if (fx_evaluations > maxevaluations)
                break;

            mX1 = mX + (nstep * 0.25) * mG; // initialize left
            fx1 = Eval_fx(mX1);

            mX2 = mX + (nstep * 0.75) * mG; // initialize right
            fx2 = Eval_fx(mX2);

            gone = false;
            if ((fx1 <= fxmid) && (fxmid <= fx2) && !gone) {
                mX = mXmid;
                fx = fxmid;
                mXmid = mX2;
                fxmid = fx2;
                gone = true;
            }
            if ((fx1 >= fxmid) && (fxmid >= fx2) && !gone) {
                mXguess = mXmid;
                fxguess = fxmid;
                mXmid = mX1;
                fxmid = fx1;
                gone = true;
            }
            if ((fx1 <= fxmid) && (fxmid >= fx2) && !gone) {
                mX = mX1;
                fx = fx1;
                mXguess = mX2;
                fxguess = fx2;
                gone = true;
            }
            if (!gone) {
                nstep *= 0.25;
                break;
            }

            if (fabs(fxmid - fx) <= fun_tol) {
                // cout << "\n              ---- ";
                sprintf(err_message, "OK,function tolerance reached.");
                goto end_opt;
            }
            // ***TO DO*** stop after "arg_tol" passed

            // half step, then repeat
            nstep *= 0.5;
        }

        if ((fx1 >= fx) && (fx1 >= fxmid) && (fx1 >= fx2) && (fx1 >= fxguess))
            mX = mX1;
        if ((fx2 >= fx) && (fx2 >= fxmid) && (fx2 >= fx1) && (fx2 >= fxguess))
            mX = mX2;
        if ((fxmid >= fx) && (fxmid >= fx1) && (fxmid >= fx2) && (fxmid >= fxguess))
            mX = mXmid;
        if ((fxguess >= fx) && (fxguess >= fx1) && (fxguess >= fx2) && (fxguess >= fxmid))
            mX = mXguess;

        fx = Eval_fx(mX);

        if (fx_evaluations > maxevaluations) {
            // cout << "\n          limit on fx evals----= ";
            sprintf(err_message, "OK, limit on max number of fx evaluations reached in %ld steps",
                    (long)grad_evaluations);
            break;
        }
        if (grad_evaluations > maxgradients) {
            // cout << "\n          limit on max gradients ---- ";
            sprintf(err_message, "OK, limit on max number of %ld gradient evaluations reached.",
                    (long)grad_evaluations);
            break;
        }
    }

    goto end_opt;

end_opt:
    // ***TO DO*** set the system at best variables among fx, fxguess, fx1, fx2;
    opt_fx = fx;

    if (C_vars) {
        for (int i = 0; i < nv; i++) {
            xv[i] = mX(i);
        };
    }  // copy result into vector xv

    return true;
}